

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.hpp
# Opt level: O0

void __thiscall helics::CommsInterface::CommsInterface(CommsInterface *this)

{
  undefined8 *in_RDI;
  undefined8 in_stack_ffffffffffffff68;
  undefined1 active;
  TriggerVariable *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  TripWireDetector *this_00;
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  *this_01;
  int local_18 [6];
  
  active = (undefined1)((ulong)in_stack_ffffffffffffff68 >> 0x38);
  *in_RDI = &PTR__CommsInterface_00a4e048;
  std::atomic<helics::CommsInterface::ConnectionStatus>::atomic
            ((atomic<helics::CommsInterface::ConnectionStatus> *)(in_RDI + 1),STARTUP);
  this_01 = (BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
             *)(in_RDI + 2);
  gmlc::concurrency::TriggerVariable::TriggerVariable(in_stack_ffffffffffffff70,(bool)active);
  std::__cxx11::string::string(in_stack_ffffffffffffff80);
  std::__cxx11::string::string(in_stack_ffffffffffffff80);
  std::__cxx11::string::string(in_stack_ffffffffffffff80);
  std::__cxx11::string::string(in_stack_ffffffffffffff80);
  std::__cxx11::string::string(in_stack_ffffffffffffff80);
  std::__cxx11::string::string(in_stack_ffffffffffffff80);
  std::atomic<helics::CommsInterface::ConnectionStatus>::atomic
            ((atomic<helics::CommsInterface::ConnectionStatus> *)(in_RDI + 0x32),STARTUP);
  gmlc::concurrency::TriggerVariable::TriggerVariable(in_stack_ffffffffffffff70,(bool)active);
  std::atomic<bool>::atomic(&in_stack_ffffffffffffff70->triggered,(bool)active);
  *(undefined1 *)((long)in_RDI + 0x259) = 0;
  *(undefined1 *)((long)in_RDI + 0x25a) = 0;
  *(undefined1 *)((long)in_RDI + 0x25b) = 1;
  *(undefined1 *)((long)in_RDI + 0x25c) = 0;
  *(undefined1 *)((long)in_RDI + 0x25d) = 0;
  *(undefined1 *)((long)in_RDI + 0x25e) = 0;
  local_18[0] = 4000;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)(in_RDI + 0x4c),local_18);
  *(undefined4 *)(in_RDI + 0x4d) = 0x4000;
  *(undefined4 *)((long)in_RDI + 0x26c) = 0x200;
  std::atomic<bool>::atomic(&in_stack_ffffffffffffff70->triggered,(bool)active);
  std::function<void_(helics::ActionMessage_&&)>::function
            ((function<void_(helics::ActionMessage_&&)> *)in_stack_ffffffffffffff70);
  this_00 = (TripWireDetector *)(in_RDI + 0x53);
  std::
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::function((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
              *)in_stack_ffffffffffffff70);
  gmlc::containers::
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  ::BlockingPriorityQueue(this_01);
  std::atomic<bool>::atomic(&in_stack_ffffffffffffff70->triggered,(bool)active);
  *(undefined1 *)((long)in_RDI + 0x3c1) = 0;
  std::thread::thread((thread *)0x4a9697);
  std::thread::thread((thread *)0x4a96ad);
  std::mutex::mutex((mutex *)0x4a96be);
  gmlc::concurrency::TripWireDetector::TripWireDetector(this_00);
  return;
}

Assistant:

CommsInterface() = default;